

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::SectionTemplateNode::SectionTemplateNode
          (SectionTemplateNode *this,TemplateToken *token,bool hidden_by_default)

{
  char *pcVar1;
  ulong uVar2;
  ostream *poVar3;
  allocator local_51;
  string local_50 [35];
  allocator local_2d [20];
  byte local_19;
  TemplateToken *pTStack_18;
  bool hidden_by_default_local;
  TemplateToken *token_local;
  SectionTemplateNode *this_local;
  
  local_19 = hidden_by_default;
  pTStack_18 = token;
  token_local = (TemplateToken *)this;
  TemplateNode::TemplateNode(&this->super_TemplateNode);
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__SectionTemplateNode_001b50c0;
  TemplateToken::TemplateToken(&this->token_,pTStack_18);
  anon_unknown_14::HashedTemplateString::HashedTemplateString
            (&this->variable_,(this->token_).text,(this->token_).textlen);
  std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::list
            (&this->node_list_);
  this->separator_section_ = (SectionTemplateNode *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->indentation_,"\n",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  this->hidden_by_default_ = (bool)(local_19 & 1);
  if (1 < kVerbosity) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"2: ");
    poVar3 = std::operator<<(poVar3,"Constructing SectionTemplateNode: ");
    pcVar1 = (this->token_).text;
    uVar2 = (this->token_).textlen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,uVar2,&local_51);
    poVar3 = std::operator<<(poVar3,local_50);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

SectionTemplateNode::SectionTemplateNode(const TemplateToken& token,
                                         bool hidden_by_default)

    : token_(token),
      variable_(token_.text, token_.textlen),
      separator_section_(NULL), indentation_("\n"),
      hidden_by_default_(hidden_by_default) {
  VLOG(2) << "Constructing SectionTemplateNode: "
          << string(token_.text, token_.textlen) << endl;
}